

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O3

void randomDistPoint(int dim,int *topologies,ANNpoint *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  ANNcoord AVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (0 < dim) {
    iVar3 = 0;
    do {
      iVar1 = rand();
      dVar4 = (double)iVar1 / 2147830000.0;
      if (topologies[iVar3] == 3) {
        iVar1 = rand();
        iVar2 = rand();
        dVar9 = ((double)iVar1 / 2147830000.0) * 6.283185307179586;
        dVar6 = ((double)iVar2 / 2147830000.0) * 3.141592653589793 + -1.5707963267948966;
        dVar7 = 1.0 - dVar4;
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        dVar8 = sin(dVar9);
        (*p)[iVar3] = dVar8 * dVar7;
        dVar9 = cos(dVar9);
        (*p)[(long)iVar3 + 1] = dVar9 * dVar7;
        dVar7 = sin(dVar6);
        (*p)[(long)iVar3 + 2] = dVar7 * dVar4;
        dVar6 = cos(dVar6);
        iVar1 = iVar3 + 3;
        (*p)[(long)iVar3 + 3] = dVar6 * dVar4;
      }
      else {
        if (topologies[iVar3] == 2) {
          AVar5 = dVar4 * 6.283185307179586 + -3.141592653589793;
        }
        else {
          AVar5 = dVar4 * 200.0 + -100.0;
        }
        (*p)[iVar3] = AVar5;
        iVar1 = iVar3;
      }
      iVar3 = iVar1 + 1;
    } while (iVar3 < dim);
  }
  return;
}

Assistant:

void randomDistPoint(int dim, const int *topologies, ANNpoint &p) {
    for (int kk = 0; kk < dim; kk++) {
        double tmp = rand() / (2.14783e+09);
        if (topologies[kk] == 2) {
            p[kk] = (2 * PI * tmp - PI);  // region -PI PI
        } else if (topologies[kk] == 3) {
            double tmp1 = rand() / (2.14783e+09);
            double tmp2 = rand() / (2.14783e+09);

            double Theta1 = 2 * PI * tmp1;
            double Theta2 = PI * tmp2 - PI / 2;
            double r1 = sqrt(1 - tmp);
            double r2 = sqrt(tmp);

            p[kk] = sin(Theta1) * r1;
            p[kk + 1] = cos(Theta1) * r1;
            p[kk + 2] = sin(Theta2) * r2;
            p[kk + 3] = cos(Theta2) * r2;

            // Modifies loop index!
            kk = kk + 3;  // random quaternions
        } else
            p[kk] = 200 * tmp - 100;  // region -100 to 100
    }
}